

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

pair<const_char_*,_bool> jsoncons::uri::is_pchar(iterator first,iterator last)

{
  byte ch;
  bool bVar1;
  assertion_error *this;
  undefined8 extraout_RDX;
  pair<const_char_*,_bool> pVar2;
  allocator<char> local_39;
  string local_38;
  
  if (first == last) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"assertion \'first != last\' failed at  <> :0",&local_39);
    assertion_error::assertion_error(this,&local_38);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ch = *first;
  bVar1 = is_unreserved(ch);
  if (bVar1) {
    pVar2._9_7_ = (int7)((ulong)extraout_RDX >> 8);
    pVar2.second = true;
    pVar2.first = first + 1;
  }
  else {
    pVar2 = is_pct_encoded(first,last);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pVar2._9_7_ = pVar2._9_7_;
      pVar2.second = (bool)((ch == 0x40 || ch == 0x3a) |
                           (byte)(0x28001fd200000000 >> (ch & 0x3f)) & ch < 0x3e);
      pVar2.first = first + 1;
    }
  }
  return pVar2;
}

Assistant:

static std::pair<string_view::const_iterator,bool> is_pchar(string_view::iterator first, string_view::iterator last)
        {
            JSONCONS_ASSERT(first != last);
            
            const char c = *first;
            if (is_unreserved(c))
            {
                return std::pair<string_view::const_iterator,bool>{first+1,true};
            }
            auto result = is_pct_encoded(first,last);
            if (result.second)
            {
                return result;
            }
            
            return std::pair<string_view::const_iterator,bool>{first+1,is_sub_delim(c) || c == ':' || c == '@'};
        }